

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,size_t escapeOffset)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  pcVar4 = is->src_;
  iVar6 = *(int *)(this + 0x30);
  uVar3 = 0;
  iVar5 = 4;
  while( true ) {
    cVar1 = *pcVar4;
    uVar3 = uVar3 * 0x10 + (int)cVar1;
    iVar7 = -0x30;
    if ((((byte)(cVar1 - 0x30U) < 10) || (iVar7 = -0x37, (byte)(cVar1 + 0xbfU) < 6)) ||
       (iVar7 = -0x57, (byte)(cVar1 + 0x9fU) < 6)) {
      uVar3 = uVar3 + iVar7;
      pcVar4 = pcVar4 + 1;
      is->src_ = pcVar4;
      bVar2 = true;
    }
    else {
      if (iVar6 != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/rapidjson/reader.h"
                      ,0x397,
                      "unsigned int rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseHex4(InputStream &, size_t) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 8;
      *(size_t *)(this + 0x38) = escapeOffset;
      iVar6 = 8;
      bVar2 = false;
    }
    if (!bVar2) break;
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      return uVar3;
    }
  }
  return 0;
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }